

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O0

uint64_t __thiscall Histogram::estimate(Histogram *this,double percentile)

{
  HistBin *pHVar1;
  __int_type _Var2;
  ulong uVar3;
  Histogram *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double base;
  uint64_t u_bound;
  uint64_t gap;
  uint64_t n_entries;
  uint64_t threshold;
  uint64_t total;
  uint64_t sum;
  size_t i;
  double rev;
  memory_order __b;
  HistItr *in_stack_ffffffffffffff38;
  double dVar11;
  double local_90;
  HistItr local_88;
  ulong local_70;
  long local_68;
  __int_type local_60;
  ulong local_58;
  uint64_t local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  __int_type local_20;
  __int_type local_18;
  memory_order local_10;
  int local_c;
  HistBin *local_8;
  
  if ((in_XMM0_Qa <= 0.0) || (100.0 <= in_XMM0_Qa)) {
    local_20 = 0;
  }
  else {
    local_38 = 100.0 - in_XMM0_Qa;
    local_48 = 0;
    local_50 = getTotal((Histogram *)0x10ebf5);
    auVar5._8_4_ = (int)(local_50 >> 0x20);
    auVar5._0_8_ = local_50;
    auVar5._12_4_ = 0x45300000;
    dVar4 = (((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) * local_38) / 100.0;
    local_58 = (ulong)dVar4;
    local_58 = local_58 | (long)(dVar4 - 9.223372036854776e+18) & (long)local_58 >> 0x3f;
    if (local_58 == 0) {
      local_20 = std::__atomic_base::operator_cast_to_unsigned_long
                           ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff38);
    }
    else {
      for (local_40 = 0; local_40 < 0x41; local_40 = local_40 + 1) {
        pHVar1 = in_RDI->bins + local_40;
        local_c = 0;
        local_8 = pHVar1;
        local_10 = std::operator&(memory_order_relaxed,__memory_order_mask);
        if (local_c - 1U < 2) {
          local_18 = (pHVar1->super___atomic_base<unsigned_long>)._M_i;
        }
        else if (local_c == 5) {
          local_18 = (pHVar1->super___atomic_base<unsigned_long>)._M_i;
        }
        else {
          local_18 = (pHVar1->super___atomic_base<unsigned_long>)._M_i;
        }
        local_60 = local_18;
        local_48 = local_18 + local_48;
        if (local_58 <= local_48) {
          local_68 = local_48 - local_58;
          HistItr::HistItr(&local_88,local_40,0x41,in_RDI);
          local_70 = HistItr::getUpperBound(in_stack_ffffffffffffff38);
          local_90 = in_RDI->EXP_BASE;
          _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff38);
          if (_Var2 < local_70) {
            _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff38);
            auVar6._8_4_ = (int)(_Var2 >> 0x20);
            auVar6._0_8_ = _Var2;
            auVar6._12_4_ = 0x45300000;
            auVar7._8_4_ = (int)(local_70 >> 0x20);
            auVar7._0_8_ = local_70;
            auVar7._12_4_ = 0x45300000;
            local_90 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) /
                       (((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0)) / 2.0);
          }
          auVar8._8_4_ = (int)((ulong)local_68 >> 0x20);
          auVar8._0_8_ = local_68;
          auVar8._12_4_ = 0x45300000;
          dVar11 = 4503599627370496.0;
          auVar10._8_4_ = (int)(local_60 >> 0x20);
          auVar10._0_8_ = local_60;
          auVar10._12_4_ = 0x45300000;
          dVar4 = pow(local_90,((auVar8._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) /
                               ((auVar10._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0)));
          auVar9._8_4_ = (int)(local_70 >> 0x20);
          auVar9._0_8_ = local_70;
          auVar9._12_4_ = 0x45300000;
          dVar4 = dVar4 * ((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_70) - dVar11)) * 0.5;
          uVar3 = (ulong)dVar4;
          return uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
        }
      }
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

uint64_t estimate(double percentile) {
        if (percentile <= 0 || percentile >= 100) {
            return 0;
        }

        double rev = 100 - percentile;
        size_t i;
        uint64_t sum = 0;
        uint64_t total = getTotal();
        uint64_t threshold = (uint64_t)( (double)total * rev / 100.0 );

        if (!threshold) {
            // No samples between the given percentile and the max number.
            // Return max number.
            return max;
        }

        for (i=0; i<MAX_BINS; ++i) {
            uint64_t n_entries = bins[i].load(std::memory_order_relaxed);
            sum += n_entries;
            if (sum < threshold) continue;

            uint64_t gap = sum - threshold;
            uint64_t u_bound = HistItr(i, MAX_BINS, this).getUpperBound();
            double base = EXP_BASE;
            if (max < u_bound) {
                base = (double)max / (u_bound / 2.0);
            }

            return (uint64_t)
                   ( std::pow(base, (double)gap / n_entries) * u_bound / 2 );
        }
        return 0;
    }